

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawLoader.h
# Opt level: O0

void __thiscall
Assimp::RAWImporter::GroupInformation::GroupInformation(GroupInformation *this,string *_name)

{
  string *_name_local;
  GroupInformation *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)_name);
  std::
  vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
  ::vector(&this->meshes);
  std::
  vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
  ::reserve(&this->meshes,10);
  return;
}

Assistant:

explicit GroupInformation(const std::string& _name)
            : name(_name)
        {
            meshes.reserve(10);
        }